

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg5.hpp
# Opt level: O3

void __thiscall trng::mrg5::split(mrg5 *this,uint s,uint n)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint i_9;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int32_t iVar16;
  uint i;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  bool bVar23;
  int32_t a [5];
  int32_t b [25];
  uint local_104;
  uint local_e4;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  int32_t iStack_ac;
  int local_a8;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  int32_t local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  
  if (s <= n) {
    std::invalid_argument::invalid_argument
              ((invalid_argument *)&local_98,"invalid argument for trng::mrg5::split");
    utility::throw_this<std::invalid_argument>((invalid_argument *)&local_98);
    std::invalid_argument::~invalid_argument((invalid_argument *)&local_98);
  }
  if (1 < s) {
    uVar3 = (ulong)n + 1;
    if (n < 0xf) {
      uVar17 = (this->S).r[0];
      uVar18 = (this->S).r[1];
      uVar19 = (this->S).r[2];
      uVar20 = (this->S).r[3];
      uVar21 = (this->S).r[4];
      do {
        uVar12 = uVar20;
        uVar20 = uVar19;
        uVar19 = uVar18;
        uVar18 = uVar17;
        uVar7 = (long)(int)uVar12 * (long)(this->P).a[3] + (long)(int)uVar20 * (long)(this->P).a[2]
                + (long)(int)uVar19 * (long)(this->P).a[1] +
                  (long)(int)uVar18 * (long)(this->P).a[0];
        uVar14 = uVar7 + 0x80000001fffffffe;
        if (uVar7 < 0x7ffffffe00000002) {
          uVar14 = uVar7;
        }
        uVar14 = (long)(int)uVar21 * (long)(this->P).a[4] + uVar14;
        uVar7 = (uVar14 >> 0x1f) + (uVar14 & 0x7fffffff);
        uVar14 = uVar7 - 0x1fffffffc;
        if (uVar7 < 0x1fffffffc) {
          uVar14 = uVar7;
        }
        uVar7 = uVar14 - 0xfffffffe;
        if (uVar14 < 0xfffffffe) {
          uVar7 = uVar14;
        }
        uVar17 = (uint)uVar7 + 0x80000001;
        if (uVar7 < 0x7fffffff) {
          uVar17 = (uint)uVar7;
        }
        uVar1 = (int)uVar3 - 1;
        uVar3 = (ulong)uVar1;
        uVar21 = uVar12;
      } while (uVar1 != 0);
      (this->S).r[0] = uVar17;
      (this->S).r[1] = uVar18;
      (this->S).r[2] = uVar19;
      (this->S).r[3] = uVar20;
      (this->S).r[4] = uVar12;
    }
    else {
      uVar17 = 0;
      do {
        if ((uVar3 & 1) != 0) {
          jump2(this,uVar17);
        }
        uVar17 = uVar17 + 1;
        bVar23 = 1 < uVar3;
        uVar3 = uVar3 >> 1;
      } while (bVar23);
      uVar17 = (this->S).r[0];
    }
    uVar3 = (ulong)s;
    if (s < 0x10) {
      uVar14 = uVar3;
      local_104 = uVar17;
      uVar18 = (this->S).r[1];
      uVar19 = (this->S).r[2];
      uVar20 = (this->S).r[3];
      uVar21 = (this->S).r[4];
      do {
        uVar12 = uVar20;
        uVar20 = uVar19;
        uVar19 = uVar18;
        uVar18 = local_104;
        uVar8 = (long)(int)uVar12 * (long)(this->P).a[3] + (long)(int)uVar20 * (long)(this->P).a[2]
                + (long)(int)uVar19 * (long)(this->P).a[1] +
                  (long)(int)uVar18 * (long)(this->P).a[0];
        uVar7 = uVar8 + 0x80000001fffffffe;
        if (uVar8 < 0x7ffffffe00000002) {
          uVar7 = uVar8;
        }
        uVar7 = (long)(int)uVar21 * (long)(this->P).a[4] + uVar7;
        uVar8 = (uVar7 >> 0x1f) + (uVar7 & 0x7fffffff);
        uVar7 = uVar8 - 0x1fffffffc;
        if (uVar8 < 0x1fffffffc) {
          uVar7 = uVar8;
        }
        uVar8 = uVar7 - 0xfffffffe;
        if (uVar7 < 0xfffffffe) {
          uVar8 = uVar7;
        }
        local_104 = (uint)uVar8 + 0x80000001;
        if (uVar8 < 0x7fffffff) {
          local_104 = (uint)uVar8;
        }
        uVar1 = (int)uVar14 - 1;
        uVar14 = (ulong)uVar1;
        uVar21 = uVar12;
      } while (uVar1 != 0);
      (this->S).r[0] = local_104;
      (this->S).r[1] = uVar18;
      (this->S).r[2] = uVar19;
      (this->S).r[3] = uVar20;
      (this->S).r[4] = uVar12;
    }
    else {
      uVar18 = 0;
      uVar14 = uVar3;
      do {
        if ((uVar14 & 1) != 0) {
          jump2(this,uVar18);
        }
        uVar18 = uVar18 + 1;
        bVar23 = 1 < uVar14;
        uVar14 = uVar14 >> 1;
      } while (bVar23);
      local_104 = (this->S).r[0];
    }
    if (s < 0x10) {
      uVar19 = (this->S).r[1];
      uVar20 = (this->S).r[2];
      uVar21 = (this->S).r[3];
      uVar12 = (this->S).r[4];
      uVar18 = local_104;
      uVar1 = s;
      do {
        uVar9 = uVar18;
        uVar10 = uVar21;
        uVar21 = uVar20;
        uVar20 = uVar19;
        uVar7 = (long)(int)uVar10 * (long)(this->P).a[3] + (long)(int)uVar21 * (long)(this->P).a[2]
                + (long)(int)uVar20 * (long)(this->P).a[1] + (long)(int)uVar9 * (long)(this->P).a[0]
        ;
        uVar14 = uVar7 + 0x80000001fffffffe;
        if (uVar7 < 0x7ffffffe00000002) {
          uVar14 = uVar7;
        }
        uVar14 = (long)(int)uVar12 * (long)(this->P).a[4] + uVar14;
        uVar7 = (uVar14 >> 0x1f) + (uVar14 & 0x7fffffff);
        uVar14 = uVar7 - 0x1fffffffc;
        if (uVar7 < 0x1fffffffc) {
          uVar14 = uVar7;
        }
        uVar7 = uVar14 - 0xfffffffe;
        if (uVar14 < 0xfffffffe) {
          uVar7 = uVar14;
        }
        uVar18 = (uint)uVar7 + 0x80000001;
        if (uVar7 < 0x7fffffff) {
          uVar18 = (uint)uVar7;
        }
        uVar1 = uVar1 - 1;
        uVar19 = uVar9;
        uVar12 = uVar10;
      } while (uVar1 != 0);
      (this->S).r[0] = uVar18;
      (this->S).r[1] = uVar9;
      (this->S).r[2] = uVar20;
      (this->S).r[3] = uVar21;
      (this->S).r[4] = uVar10;
    }
    else {
      uVar18 = 0;
      uVar14 = uVar3;
      do {
        if ((uVar14 & 1) != 0) {
          jump2(this,uVar18);
        }
        uVar18 = uVar18 + 1;
        bVar23 = 1 < uVar14;
        uVar14 = uVar14 >> 1;
      } while (bVar23);
      uVar18 = (this->S).r[0];
    }
    if (s < 0x10) {
      uVar19 = uVar18;
      uVar20 = (this->S).r[1];
      uVar21 = (this->S).r[2];
      uVar12 = (this->S).r[3];
      uVar1 = (this->S).r[4];
      uVar9 = s;
      do {
        uVar10 = uVar12;
        uVar12 = uVar21;
        uVar21 = uVar20;
        uVar20 = uVar19;
        uVar7 = (long)(int)uVar10 * (long)(this->P).a[3] + (long)(int)uVar12 * (long)(this->P).a[2]
                + (long)(int)uVar21 * (long)(this->P).a[1] +
                  (long)(int)uVar20 * (long)(this->P).a[0];
        uVar14 = uVar7 + 0x80000001fffffffe;
        if (uVar7 < 0x7ffffffe00000002) {
          uVar14 = uVar7;
        }
        uVar14 = (long)(int)uVar1 * (long)(this->P).a[4] + uVar14;
        uVar7 = (uVar14 >> 0x1f) + (uVar14 & 0x7fffffff);
        uVar14 = uVar7 - 0x1fffffffc;
        if (uVar7 < 0x1fffffffc) {
          uVar14 = uVar7;
        }
        uVar7 = uVar14 - 0xfffffffe;
        if (uVar14 < 0xfffffffe) {
          uVar7 = uVar14;
        }
        uVar19 = (uint)uVar7 + 0x80000001;
        if (uVar7 < 0x7fffffff) {
          uVar19 = (uint)uVar7;
        }
        uVar9 = uVar9 - 1;
        uVar1 = uVar10;
      } while (uVar9 != 0);
      (this->S).r[0] = uVar19;
      (this->S).r[1] = uVar20;
      (this->S).r[2] = uVar21;
      (this->S).r[3] = uVar12;
      (this->S).r[4] = uVar10;
    }
    else {
      uVar19 = 0;
      uVar14 = uVar3;
      do {
        if ((uVar14 & 1) != 0) {
          jump2(this,uVar19);
        }
        uVar19 = uVar19 + 1;
        bVar23 = 1 < uVar14;
        uVar14 = uVar14 >> 1;
      } while (bVar23);
      uVar19 = (this->S).r[0];
    }
    if (s < 0x10) {
      local_e4 = uVar19;
      uVar20 = (this->S).r[1];
      uVar21 = (this->S).r[2];
      uVar12 = (this->S).r[3];
      uVar1 = (this->S).r[4];
      uVar9 = s;
      do {
        uVar10 = uVar12;
        uVar12 = uVar21;
        uVar21 = uVar20;
        uVar20 = local_e4;
        uVar7 = (long)(int)uVar10 * (long)(this->P).a[3] + (long)(int)uVar12 * (long)(this->P).a[2]
                + (long)(int)uVar21 * (long)(this->P).a[1] +
                  (long)(int)uVar20 * (long)(this->P).a[0];
        uVar14 = uVar7 + 0x80000001fffffffe;
        if (uVar7 < 0x7ffffffe00000002) {
          uVar14 = uVar7;
        }
        uVar14 = (long)(int)uVar1 * (long)(this->P).a[4] + uVar14;
        uVar7 = (uVar14 >> 0x1f) + (uVar14 & 0x7fffffff);
        uVar14 = uVar7 - 0x1fffffffc;
        if (uVar7 < 0x1fffffffc) {
          uVar14 = uVar7;
        }
        uVar7 = uVar14 - 0xfffffffe;
        if (uVar14 < 0xfffffffe) {
          uVar7 = uVar14;
        }
        local_e4 = (uint)uVar7 + 0x80000001;
        if (uVar7 < 0x7fffffff) {
          local_e4 = (uint)uVar7;
        }
        uVar9 = uVar9 - 1;
        uVar1 = uVar10;
      } while (uVar9 != 0);
      (this->S).r[0] = local_e4;
      (this->S).r[1] = uVar20;
      (this->S).r[2] = uVar21;
      (this->S).r[3] = uVar12;
      (this->S).r[4] = uVar10;
    }
    else {
      uVar20 = 0;
      uVar14 = uVar3;
      do {
        if ((uVar14 & 1) != 0) {
          jump2(this,uVar20);
        }
        uVar20 = uVar20 + 1;
        bVar23 = 1 < uVar14;
        uVar14 = uVar14 >> 1;
      } while (bVar23);
      local_e4 = (this->S).r[0];
    }
    if (s < 0x10) {
      uVar21 = (this->S).r[1];
      uVar12 = (this->S).r[2];
      uVar1 = (this->S).r[3];
      uVar9 = (this->S).r[4];
      uVar20 = local_e4;
      uVar10 = s;
      do {
        uVar11 = uVar20;
        uVar4 = uVar1;
        uVar1 = uVar12;
        uVar12 = uVar21;
        uVar7 = (long)(int)uVar4 * (long)(this->P).a[3] + (long)(int)uVar1 * (long)(this->P).a[2] +
                (long)(int)uVar12 * (long)(this->P).a[1] + (long)(int)uVar11 * (long)(this->P).a[0];
        uVar14 = uVar7 + 0x80000001fffffffe;
        if (uVar7 < 0x7ffffffe00000002) {
          uVar14 = uVar7;
        }
        uVar14 = (long)(int)uVar9 * (long)(this->P).a[4] + uVar14;
        uVar7 = (uVar14 >> 0x1f) + (uVar14 & 0x7fffffff);
        uVar14 = uVar7 - 0x1fffffffc;
        if (uVar7 < 0x1fffffffc) {
          uVar14 = uVar7;
        }
        uVar7 = uVar14 - 0xfffffffe;
        if (uVar14 < 0xfffffffe) {
          uVar7 = uVar14;
        }
        uVar20 = (uint)uVar7 + 0x80000001;
        if (uVar7 < 0x7fffffff) {
          uVar20 = (uint)uVar7;
        }
        uVar10 = uVar10 - 1;
        uVar21 = uVar11;
        uVar9 = uVar4;
      } while (uVar10 != 0);
      (this->S).r[0] = uVar20;
      (this->S).r[1] = uVar11;
      (this->S).r[2] = uVar12;
      (this->S).r[3] = uVar1;
      (this->S).r[4] = uVar4;
    }
    else {
      uVar20 = 0;
      uVar14 = uVar3;
      do {
        if ((uVar14 & 1) != 0) {
          jump2(this,uVar20);
        }
        uVar20 = uVar20 + 1;
        bVar23 = 1 < uVar14;
        uVar14 = uVar14 >> 1;
      } while (bVar23);
      uVar20 = (this->S).r[0];
    }
    if (s < 0x10) {
      uVar12 = (this->S).r[1];
      uVar1 = (this->S).r[2];
      uVar9 = (this->S).r[3];
      uVar10 = (this->S).r[4];
      uVar21 = uVar20;
      uVar11 = s;
      do {
        uVar4 = uVar21;
        uVar5 = uVar9;
        uVar9 = uVar1;
        uVar1 = uVar12;
        uVar7 = (long)(int)uVar5 * (long)(this->P).a[3] + (long)(int)uVar9 * (long)(this->P).a[2] +
                (long)(int)uVar1 * (long)(this->P).a[1] + (long)(int)uVar4 * (long)(this->P).a[0];
        uVar14 = uVar7 + 0x80000001fffffffe;
        if (uVar7 < 0x7ffffffe00000002) {
          uVar14 = uVar7;
        }
        uVar14 = (long)(int)uVar10 * (long)(this->P).a[4] + uVar14;
        uVar7 = (uVar14 >> 0x1f) + (uVar14 & 0x7fffffff);
        uVar14 = uVar7 - 0x1fffffffc;
        if (uVar7 < 0x1fffffffc) {
          uVar14 = uVar7;
        }
        uVar7 = uVar14 - 0xfffffffe;
        if (uVar14 < 0xfffffffe) {
          uVar7 = uVar14;
        }
        uVar21 = (uint)uVar7 + 0x80000001;
        if (uVar7 < 0x7fffffff) {
          uVar21 = (uint)uVar7;
        }
        uVar11 = uVar11 - 1;
        uVar12 = uVar4;
        uVar10 = uVar5;
      } while (uVar11 != 0);
      (this->S).r[0] = uVar21;
      (this->S).r[1] = uVar4;
      (this->S).r[2] = uVar1;
      (this->S).r[3] = uVar9;
      (this->S).r[4] = uVar5;
    }
    else {
      uVar21 = 0;
      uVar14 = uVar3;
      do {
        if ((uVar14 & 1) != 0) {
          jump2(this,uVar21);
        }
        uVar21 = uVar21 + 1;
        bVar23 = 1 < uVar14;
        uVar14 = uVar14 >> 1;
      } while (bVar23);
      uVar21 = (this->S).r[0];
    }
    uVar14 = (ulong)uVar21;
    if (s < 0x10) {
      iVar2 = (this->S).r[1];
      iVar13 = (this->S).r[2];
      iVar22 = (this->S).r[3];
      iVar15 = (this->S).r[4];
      uVar12 = s;
      do {
        iVar6 = iVar22;
        iVar22 = iVar13;
        iVar13 = iVar2;
        iVar2 = (int)uVar14;
        uVar7 = (long)iVar6 * (long)(this->P).a[3] + (long)iVar22 * (long)(this->P).a[2] +
                (long)iVar13 * (long)(this->P).a[1] + (long)iVar2 * (long)(this->P).a[0];
        uVar14 = uVar7 + 0x80000001fffffffe;
        if (uVar7 < 0x7ffffffe00000002) {
          uVar14 = uVar7;
        }
        uVar14 = (long)iVar15 * (long)(this->P).a[4] + uVar14;
        uVar7 = (uVar14 >> 0x1f) + (uVar14 & 0x7fffffff);
        uVar14 = uVar7 - 0x1fffffffc;
        if (uVar7 < 0x1fffffffc) {
          uVar14 = uVar7;
        }
        uVar7 = uVar14 - 0xfffffffe;
        if (uVar14 < 0xfffffffe) {
          uVar7 = uVar14;
        }
        uVar14 = (ulong)((int)uVar7 + 0x80000001);
        if (uVar7 < 0x7fffffff) {
          uVar14 = uVar7 & 0xffffffff;
        }
        uVar12 = uVar12 - 1;
        iVar15 = iVar6;
      } while (uVar12 != 0);
      uVar12 = (uint)uVar14;
      (this->S).r[0] = uVar12;
      (this->S).r[1] = iVar2;
      (this->S).r[2] = iVar13;
      (this->S).r[3] = iVar22;
      (this->S).r[4] = iVar6;
    }
    else {
      uVar12 = 0;
      uVar14 = uVar3;
      do {
        if ((uVar14 & 1) != 0) {
          jump2(this,uVar12);
        }
        uVar12 = uVar12 + 1;
        bVar23 = 1 < uVar14;
        uVar14 = uVar14 >> 1;
      } while (bVar23);
      uVar12 = (this->S).r[0];
    }
    if (s < 0x10) {
      uVar14 = (ulong)uVar12;
      iVar2 = (this->S).r[1];
      iVar13 = (this->S).r[2];
      iVar22 = (this->S).r[3];
      iVar15 = (this->S).r[4];
      uVar1 = s;
      do {
        iVar6 = iVar22;
        iVar22 = iVar13;
        iVar13 = iVar2;
        iVar2 = (int)uVar14;
        uVar7 = (long)iVar6 * (long)(this->P).a[3] + (long)iVar22 * (long)(this->P).a[2] +
                (long)iVar13 * (long)(this->P).a[1] + (long)iVar2 * (long)(this->P).a[0];
        uVar14 = uVar7 + 0x80000001fffffffe;
        if (uVar7 < 0x7ffffffe00000002) {
          uVar14 = uVar7;
        }
        uVar14 = (long)iVar15 * (long)(this->P).a[4] + uVar14;
        uVar7 = (uVar14 >> 0x1f) + (uVar14 & 0x7fffffff);
        uVar14 = uVar7 - 0x1fffffffc;
        if (uVar7 < 0x1fffffffc) {
          uVar14 = uVar7;
        }
        uVar7 = uVar14 - 0xfffffffe;
        if (uVar14 < 0xfffffffe) {
          uVar7 = uVar14;
        }
        uVar14 = (ulong)((int)uVar7 + 0x80000001);
        if (uVar7 < 0x7fffffff) {
          uVar14 = uVar7 & 0xffffffff;
        }
        uVar1 = uVar1 - 1;
        iVar15 = iVar6;
      } while (uVar1 != 0);
      (this->S).r[0] = (int)uVar14;
      (this->S).r[1] = iVar2;
      (this->S).r[2] = iVar13;
      (this->S).r[3] = iVar22;
      (this->S).r[4] = iVar6;
    }
    else {
      uVar1 = 0;
      uVar14 = uVar3;
      do {
        if ((uVar14 & 1) != 0) {
          jump2(this,uVar1);
        }
        uVar1 = uVar1 + 1;
        bVar23 = 1 < uVar14;
        uVar14 = uVar14 >> 1;
      } while (bVar23);
      uVar14 = (ulong)(uint)(this->S).r[0];
    }
    iVar16 = (int32_t)uVar14;
    if (s < 0x10) {
      iVar2 = (this->S).r[1];
      iVar13 = (this->S).r[2];
      iVar22 = (this->S).r[3];
      iVar15 = (this->S).r[4];
      do {
        iVar6 = iVar22;
        iVar22 = iVar13;
        iVar13 = iVar2;
        iVar2 = (int)uVar14;
        uVar14 = (long)iVar6 * (long)(this->P).a[3] + (long)iVar22 * (long)(this->P).a[2] +
                 (long)iVar13 * (long)(this->P).a[1] + (long)iVar2 * (long)(this->P).a[0];
        uVar3 = uVar14 + 0x80000001fffffffe;
        if (uVar14 < 0x7ffffffe00000002) {
          uVar3 = uVar14;
        }
        uVar3 = (long)iVar15 * (long)(this->P).a[4] + uVar3;
        uVar14 = (uVar3 >> 0x1f) + (uVar3 & 0x7fffffff);
        uVar3 = uVar14 - 0x1fffffffc;
        if (uVar14 < 0x1fffffffc) {
          uVar3 = uVar14;
        }
        uVar7 = uVar3 - 0xfffffffe;
        if (uVar3 < 0xfffffffe) {
          uVar7 = uVar3;
        }
        uVar14 = (ulong)((int)uVar7 + 0x80000001);
        if (uVar7 < 0x7fffffff) {
          uVar14 = uVar7 & 0xffffffff;
        }
        local_a8 = (int)uVar14;
        s = s - 1;
        iVar15 = iVar6;
      } while (s != 0);
      (this->S).r[0] = local_a8;
      (this->S).r[1] = iVar2;
      (this->S).r[2] = iVar13;
      (this->S).r[3] = iVar22;
      (this->S).r[4] = iVar6;
    }
    else {
      uVar1 = 0;
      do {
        if ((uVar3 & 1) != 0) {
          jump2(this,uVar1);
        }
        uVar1 = uVar1 + 1;
        bVar23 = 1 < uVar3;
        uVar3 = uVar3 >> 1;
      } while (bVar23);
      local_a8 = (this->S).r[0];
    }
    local_98 = local_e4;
    local_8c = local_104;
    local_80 = local_e4;
    local_74 = local_104;
    local_68 = local_e4;
    local_50 = local_e4;
    local_38 = local_e4;
    local_b8 = uVar20;
    uStack_b4 = uVar21;
    uStack_b0 = uVar12;
    iStack_ac = iVar16;
    local_94 = uVar19;
    local_90 = uVar18;
    local_88 = uVar17;
    local_84 = uVar20;
    local_7c = uVar19;
    local_78 = uVar18;
    local_70 = uVar21;
    local_6c = uVar20;
    local_64 = uVar19;
    local_60 = uVar18;
    local_5c = uVar12;
    local_58 = uVar21;
    local_54 = uVar20;
    local_4c = uVar19;
    local_48 = iVar16;
    local_44 = uVar12;
    local_40 = uVar21;
    local_3c = uVar20;
    int_math::gauss<5>((int32_t (*) [25])&local_98,(int32_t (*) [5])&local_b8,0x7fffffff);
    *(ulong *)(this->P).a = CONCAT44(uStack_b4,local_b8);
    *(ulong *)((this->P).a + 2) = CONCAT44(iStack_ac,uStack_b0);
    (this->P).a[4] = local_a8;
    (this->S).r[0] = local_e4;
    (this->S).r[1] = uVar19;
    (this->S).r[2] = uVar18;
    (this->S).r[3] = local_104;
    (this->S).r[4] = uVar17;
    iVar2 = 5;
    do {
      backward(this);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg5::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(std::invalid_argument("invalid argument for trng::mrg5::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      const int32_t q0{S.r[0]};
      jump(s);
      const int32_t q1{S.r[0]};
      jump(s);
      const int32_t q2{S.r[0]};
      jump(s);
      const int32_t q3{S.r[0]};
      jump(s);
      const int32_t q4{S.r[0]};
      jump(s);
      const int32_t q5{S.r[0]};
      jump(s);
      const int32_t q6{S.r[0]};
      jump(s);
      const int32_t q7{S.r[0]};
      jump(s);
      const int32_t q8{S.r[0]};
      jump(s);
      const int32_t q9{S.r[0]};
      int32_t a[5], b[25];
      a[0] = q5;
      b[0] = q4;
      b[1] = q3;
      b[2] = q2;
      b[3] = q1;
      b[4] = q0;
      a[1] = q6;
      b[5] = q5;
      b[6] = q4;
      b[7] = q3;
      b[8] = q2;
      b[9] = q1;
      a[2] = q7;
      b[10] = q6;
      b[11] = q5;
      b[12] = q4;
      b[13] = q3;
      b[14] = q2;
      a[3] = q8;
      b[15] = q7;
      b[16] = q6;
      b[17] = q5;
      b[18] = q4;
      b[19] = q3;
      a[4] = q9;
      b[20] = q8;
      b[21] = q7;
      b[22] = q6;
      b[23] = q5;
      b[24] = q4;
      int_math::gauss<5>(b, a, modulus);
      P.a[0] = a[0];
      P.a[1] = a[1];
      P.a[2] = a[2];
      P.a[3] = a[3];
      P.a[4] = a[4];
      S.r[0] = q4;
      S.r[1] = q3;
      S.r[2] = q2;
      S.r[3] = q1;
      S.r[4] = q0;
      for (int i{0}; i < 5; ++i)
        backward();
    }
  }